

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmInstruction * UnderlyingValue(VmInstruction *inst)

{
  uint uVar1;
  VmValue **ppVVar2;
  VmInstruction *pVVar3;
  VmInstruction *pVVar4;
  VmInstruction *inst_00;
  VmInstruction *source;
  VmInstruction *destination;
  uint argumentPos;
  VmInstruction *instruction;
  uint userPos;
  VmInstruction *argument;
  VmInstruction *inst_local;
  
  if (inst->cmd == VM_INST_MOV) {
    ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,0);
    pVVar3 = getType<VmInstruction>(*ppVVar2);
    if (pVVar3 == (VmInstruction *)0x0) {
      __assert_fail("argument",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x1d05,"VmInstruction *UnderlyingValue(VmInstruction *)");
    }
    inst_local = UnderlyingValue(pVVar3);
  }
  else {
    inst_local = inst;
    if (inst->cmd == VM_INST_DEF) {
      for (instruction._4_4_ = 0;
          uVar1 = SmallArray<VmValue_*,_8U>::size(&(inst->super_VmValue).users),
          instruction._4_4_ < uVar1; instruction._4_4_ = instruction._4_4_ + 1) {
        ppVVar2 = SmallArray<VmValue_*,_8U>::operator[]
                            (&(inst->super_VmValue).users,instruction._4_4_);
        pVVar3 = getType<VmInstruction>(*ppVVar2);
        if ((pVVar3 != (VmInstruction *)0x0) && (pVVar3->cmd == VM_INST_PARALLEL_COPY)) {
          for (destination._4_4_ = 0; uVar1 = SmallArray<VmValue_*,_4U>::size(&pVVar3->arguments),
              destination._4_4_ < uVar1; destination._4_4_ = destination._4_4_ + 2) {
            ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&pVVar3->arguments,destination._4_4_);
            pVVar4 = getType<VmInstruction>(*ppVVar2);
            ppVVar2 = SmallArray<VmValue_*,_4U>::operator[]
                                (&pVVar3->arguments,destination._4_4_ + 1);
            inst_00 = getType<VmInstruction>(*ppVVar2);
            if (pVVar4 == (VmInstruction *)0x0) {
              __assert_fail("destination",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1d17,"VmInstruction *UnderlyingValue(VmInstruction *)");
            }
            if (inst_00 == (VmInstruction *)0x0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1d18,"VmInstruction *UnderlyingValue(VmInstruction *)");
            }
            if (inst == pVVar4) {
              pVVar3 = UnderlyingValue(inst_00);
              return pVVar3;
            }
          }
        }
      }
    }
  }
  return inst_local;
}

Assistant:

VmInstruction* UnderlyingValue(VmInstruction *inst)
{
	if(inst->cmd == VM_INST_MOV)
	{
		VmInstruction *argument = getType<VmInstruction>(inst->arguments[0]);

		assert(argument);

		return UnderlyingValue(argument);
	}

	if(inst->cmd == VM_INST_DEF)
	{
		for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

			if(instruction && instruction->cmd == VM_INST_PARALLEL_COPY)
			{
				for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
				{
					VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
					VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

					assert(destination);
					assert(source);

					if(inst == destination)
						return UnderlyingValue(source);
				}
			}
		}
	}

	return inst;
}